

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O1

istream * spvtools::utils::operator>>
                    (istream *is,
                    HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                    *value)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  void *pvVar12;
  long lVar13;
  ulong uVar14;
  uint_type uVar15;
  ulong uVar16;
  byte bVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  char cVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  double float_val;
  ulong local_68;
  ulong local_58;
  
  (value->value_).data_ = 0;
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x19] & 0x10) != 0) {
    while( true ) {
      iVar7 = std::istream::peek();
      iVar7 = isspace(iVar7);
      if (iVar7 == 0) break;
      std::istream::get();
    }
  }
  iVar4 = std::istream::peek();
  iVar7 = (int)is;
  if ((iVar4 != 0x2d) && (iVar4 != 0x30)) {
    std::istream::_M_extract<double>((double *)is);
    (value->value_).data_ = 0;
    if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
      return is;
    }
    (value->value_).data_ = 0;
    return is;
  }
  iVar5 = iVar4;
  if (iVar4 == 0x2d) {
    std::istream::get();
    iVar5 = std::istream::peek();
  }
  if (iVar5 != 0x30) {
    if ((iVar4 == 0x2d) && ((iVar5 = std::istream::peek(), iVar5 == 0x2d || (iVar5 == 0x2b)))) {
      (value->value_).data_ = 0;
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)is + -0x18));
      if ((iVar5 - 0x2bU & 0xfffffffd) == 0) {
        return is;
      }
    }
    std::istream::_M_extract<double>((double *)is);
    uVar15 = 0x8000000000000000;
    if (iVar4 != 0x2d) {
      uVar15 = 0;
    }
    (value->value_).data_ = uVar15;
    if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
      return is;
    }
    (value->value_).data_ = 0;
    return is;
  }
  std::istream::get();
  uVar6 = std::istream::peek();
  if ((uVar6 & 0xffffffdf) == 0x58) {
    std::istream::get();
  }
  else {
    std::istream::unget();
    if ((iVar4 == 0x2d) && ((iVar5 = std::istream::peek(), iVar5 == 0x2d || (iVar5 == 0x2b)))) {
      (value->value_).data_ = 0;
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)is + -0x18));
      if ((iVar5 - 0x2bU & 0xfffffffd) == 0) goto LAB_005e599b;
    }
    std::istream::_M_extract<double>((double *)is);
    uVar15 = 0x8000000000000000;
    if (iVar4 != 0x2d) {
      uVar15 = 0;
    }
    (value->value_).data_ = uVar15;
    if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
      (value->value_).data_ = 0;
    }
  }
LAB_005e599b:
  if ((uVar6 & 0xffffffdf) != 0x58) {
    return is;
  }
  while (uVar6 = std::istream::peek(), uVar6 == 0x30) {
    std::istream::get();
  }
  uVar16 = (ulong)uVar6;
  lVar20 = 0x3ff;
  bVar1 = false;
  bVar24 = false;
  local_58 = 0;
  bVar2 = 0;
  bVar17 = 0;
  uVar18 = 0;
  do {
    iVar5 = (int)uVar16;
    if (iVar5 == 0x2e) {
      bVar24 = true;
    }
    else if (iVar5 == 0x70) {
      bVar1 = true;
    }
    else {
      iVar9 = isxdigit(iVar5);
      if (iVar9 == 0) goto LAB_005e5e05;
      pvVar12 = memchr("0123456789",iVar5,0xb);
      if (pvVar12 == (void *)0x0) {
        cVar21 = -0x6f;
        pvVar12 = memchr("abcdef",iVar5,7);
        if (pvVar12 == (void *)0x0) {
          cVar21 = -0x68;
          pvVar12 = memchr("ABCDEF",iVar5,7);
          if (pvVar12 == (void *)0x0) goto LAB_005e5f4e;
        }
        bVar2 = ((char)pvVar12 - cVar21) + 10;
      }
      else {
        bVar2 = (char)pvVar12 - 7;
      }
      uVar11 = (uint)bVar2;
      bVar22 = false;
      uVar6 = 0;
      lVar19 = lVar20;
      do {
        uVar8 = uVar11 & 8;
        lVar20 = lVar19;
        if (bVar17 == 0) {
LAB_005e5b0c:
          bVar17 = bVar17 | (byte)(uVar8 >> 3);
          bVar3 = true;
        }
        else {
          uVar16 = (ulong)(uVar8 >> 3) << (~(byte)uVar18 & 0x3f);
          if (uVar8 == 0) {
            uVar16 = 0;
          }
          if (0x3f < uVar18) {
            uVar16 = 0;
          }
          local_58 = local_58 | uVar16;
          uVar18 = uVar18 + 1;
          if (uVar18 == 0) {
            uVar18 = 0xffffffffffffffff;
          }
          lVar20 = lVar19 + 1;
          if (lVar19 != 0x7fffffffffffffff) goto LAB_005e5b0c;
          std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)is + -0x18));
          bVar3 = false;
          lVar20 = 0x7fffffffffffffff;
        }
        if (!bVar3) break;
        uVar11 = uVar11 * 2;
        bVar22 = 2 < uVar6;
        uVar6 = uVar6 + 1;
        lVar19 = lVar20;
      } while (uVar6 != 4);
      bVar2 = 1;
      if (!bVar22) {
        return is;
      }
    }
    std::istream::get();
    uVar6 = std::istream::peek();
    uVar16 = (ulong)uVar6;
  } while ((!bVar1) && (!bVar24));
  if (!(bool)(bVar24 ^ 1U | bVar1)) {
    uVar6 = 0;
    do {
      iVar5 = (int)uVar16;
      if (iVar5 == 0x70) {
        bVar1 = true;
      }
      else {
        iVar9 = isxdigit(iVar5);
        if (iVar9 == 0) goto LAB_005e5e05;
        pvVar12 = memchr("0123456789",iVar5,0xb);
        if (pvVar12 == (void *)0x0) {
          cVar21 = -0x6f;
          pvVar12 = memchr("abcdef",iVar5,7);
          if (pvVar12 == (void *)0x0) {
            cVar21 = -0x68;
            pvVar12 = memchr("ABCDEF",iVar5,7);
            if (pvVar12 == (void *)0x0) {
LAB_005e5f4e:
              __assert_fail("false && \"This was called with a non-hex character\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/hex_float.h"
                            ,0x2dd,"uint8_t spvtools::utils::get_nibble_from_character(int)");
            }
          }
          bVar17 = ((char)pvVar12 - cVar21) + 10;
        }
        else {
          bVar17 = (char)pvVar12 - 7;
        }
        uVar8 = (uint)bVar17;
        bVar22 = false;
        uVar11 = 0;
        do {
          uVar10 = uVar8 >> 3 & 1;
          uVar6 = uVar6 | uVar10;
          if ((bVar2 == 0) && (uVar6 == 0)) {
            bVar3 = true;
            bVar23 = lVar20 == -0x8000000000000000;
            lVar20 = lVar20 + -1;
            if (bVar23) {
              lVar20 = -0x8000000000000000;
              std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)is + -0x18));
              bVar3 = false;
            }
          }
          else {
            uVar16 = (ulong)uVar10 << (~(byte)uVar18 & 0x3f);
            if (uVar10 == 0) {
              uVar16 = 0;
            }
            if (0x3f < uVar18) {
              uVar16 = 0;
            }
            local_58 = local_58 | uVar16;
            uVar18 = uVar18 + 1;
            if (uVar18 == 0) {
              uVar18 = 0xffffffffffffffff;
            }
            bVar3 = true;
          }
          if (!bVar3) break;
          uVar8 = uVar8 * 2;
          bVar22 = 2 < uVar11;
          uVar11 = uVar11 + 1;
        } while (uVar11 != 4);
        if (!bVar22) {
          return is;
        }
      }
      std::istream::get();
      uVar11 = std::istream::peek();
      uVar16 = (ulong)uVar11;
    } while (!(bool)(bVar24 ^ 1U) && !bVar1);
  }
  bVar17 = 1;
  bVar24 = false;
  local_68 = 0x7ffffffffffffffe;
  bVar1 = false;
  uVar18 = 0;
  do {
    iVar5 = (int)uVar16;
    if ((bVar1) || ((iVar5 != 0x2d && (iVar5 != 0x2b)))) {
      if (9 < iVar5 - 0x30U) {
        if (bVar1) {
          lVar19 = uVar18 * (long)(char)bVar17;
          if ((lVar19 < 0) || (lVar20 < 0)) {
            if ((lVar19 < 0) && (lVar20 < 0)) {
              lVar13 = lVar20 + 0x7ffffffffffffffe;
              uVar18 = lVar19 + lVar20;
              if (lVar13 == -lVar19 || SBORROW8(lVar13,-lVar19) != lVar13 + lVar19 < 0) {
                uVar18 = 0x8000000000000002;
              }
            }
            else {
              uVar18 = lVar19 + lVar20;
            }
          }
          else {
            uVar18 = lVar20 + lVar19;
            if (0x7ffffffffffffffe - lVar20 <= lVar19) {
              uVar18 = local_68;
            }
          }
          bVar24 = local_58 == 0;
          bVar1 = (bool)(~bVar2 & bVar24);
          uVar16 = uVar18 - 1;
          local_58 = local_58 << ~(bVar2 | bVar24);
          uVar14 = local_58 >> 1 | 0x8000000000000000;
          if (bVar1) {
            uVar14 = local_58;
            uVar18 = 0;
          }
          if (bVar2 == 0 && !bVar24) {
            uVar18 = uVar16;
          }
          if (0 < (long)uVar18) {
            uVar14 = local_58;
          }
          uVar14 = uVar14 >> 0xc;
          if (((long)uVar18 < 0) && (!bVar1)) {
            uVar16 = uVar14;
            do {
              uVar14 = uVar16 >> 1;
              uVar18 = uVar18 + 1;
              if (uVar16 < 2) {
                bVar1 = true;
                uVar18 = 0;
              }
            } while (((long)uVar18 < 0) && (uVar16 = uVar14, !bVar1));
          }
          uVar16 = 0x7ff;
          if ((long)uVar18 < 0x7ff) {
            uVar16 = uVar18;
          }
          if (0x7ff < (long)uVar18) {
            uVar14 = 0;
          }
          uVar18 = 0x8000000000000000;
          if (iVar4 != 0x2d) {
            uVar18 = 0;
          }
          (value->value_).data_ = (uVar16 & 0x7ff) << 0x34 | uVar18 | uVar14;
          return is;
        }
LAB_005e5e05:
        std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)is + -0x18));
        return is;
      }
      bVar1 = (long)((0x800000000000002e - uVar16) / 10) <= (long)uVar18;
      uVar18 = (uVar16 - 0x30) + uVar18 * 10;
      if (bVar1) {
        uVar18 = local_68;
      }
      bVar1 = true;
    }
    else {
      if (bVar24) goto LAB_005e5e05;
      bVar17 = -(iVar5 == 0x2d) | 1;
      bVar24 = true;
    }
    std::istream::get();
    uVar6 = std::istream::peek();
    uVar16 = (ulong)uVar6;
  } while( true );
}

Assistant:

std::istream& operator>>(std::istream& is, HexFloat<T, Traits>& value) {
  using HF = HexFloat<T, Traits>;
  using uint_type = typename HF::uint_type;
  using int_type = typename HF::int_type;

  value.set_value(static_cast<typename HF::native_type>(0.f));

  if (is.flags() & std::ios::skipws) {
    // If the user wants to skip whitespace , then we should obey that.
    while (std::isspace(is.peek())) {
      is.get();
    }
  }

  auto next_char = is.peek();
  bool negate_value = false;

  if (next_char != '-' && next_char != '0') {
    return ParseNormalFloat(is, negate_value, value);
  }

  if (next_char == '-') {
    negate_value = true;
    is.get();
    next_char = is.peek();
  }

  if (next_char == '0') {
    is.get();  // We may have to unget this.
    auto maybe_hex_start = is.peek();
    if (maybe_hex_start != 'x' && maybe_hex_start != 'X') {
      is.unget();
      return ParseNormalFloat(is, negate_value, value);
    } else {
      is.get();  // Throw away the 'x';
    }
  } else {
    return ParseNormalFloat(is, negate_value, value);
  }

  // This "looks" like a hex-float so treat it as one.
  bool seen_p = false;
  bool seen_dot = false;

  // The mantissa bits, without the most significant 1 bit, and with the
  // the most recently read bits in the least significant positions.
  uint_type fraction = 0;
  // The number of mantissa bits that have been read, including the leading 1
  // bit that is not written into 'fraction'.
  uint_type fraction_index = 0;

  // TODO(dneto): handle overflow and underflow
  int_type exponent = HF::exponent_bias;

  // Strip off leading zeros so we don't have to special-case them later.
  while ((next_char = is.peek()) == '0') {
    is.get();
  }

  // Does the mantissa, as written, have non-zero digits to the left of
  // the decimal point.  Assume no until proven otherwise.
  bool has_integer_part = false;
  bool bits_written = false;  // Stays false until we write a bit.

  // Scan the mantissa hex digits until we see a '.' or the 'p' that
  // starts the exponent.
  while (!seen_p && !seen_dot) {
    // Handle characters that are left of the fractional part.
    if (next_char == '.') {
      seen_dot = true;
    } else if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      // We have stripped all leading zeroes and we have not yet seen a ".".
      has_integer_part = true;
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x1 : 0x0;
        if (bits_written) {
          // If we are here the bits represented belong in the fractional
          // part of the float, and we have to adjust the exponent accordingly.
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
          if (!detail::saturated_inc(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        }
        // Since this updated after setting fraction bits, this effectively
        // drops the leading 1 bit.
        bits_written |= write_bit != 0;
      }
    } else {
      // We have not found our exponent yet, so we have to fail.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding any '.' or 'p'.

  bits_written = false;
  while (seen_dot && !seen_p) {
    // Handle only fractional parts now.
    if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x01 : 0x00;
        bits_written |= write_bit != 0;
        if ((!has_integer_part) && !bits_written) {
          // Handle modifying the exponent here this way we can handle
          // an arbitrary number of hex values without overflowing our
          // integer.
          if (!detail::saturated_dec(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        } else {
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
        }
      }
    } else {
      // We still have not found our 'p' exponent yet, so this is not a valid
      // hex-float.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding 'p'.
  // In hex floats syntax, the binary exponent is required.

  bool seen_exponent_sign = false;
  int8_t exponent_sign = 1;
  bool seen_written_exponent_digits = false;
  // The magnitude of the exponent, as written, or the sentinel value to signal
  // overflow.
  int_type written_exponent = 0;
  // A sentinel value signalling overflow of the magnitude of the written
  // exponent.  We'll assume that -written_exponent_overflow is valid for the
  // type. Later we may add 1 or subtract 1 from the adjusted exponent, so leave
  // room for an extra 1.
  const int_type written_exponent_overflow =
      std::numeric_limits<int_type>::max() - 1;
  while (true) {
    if (!seen_written_exponent_digits &&
        (next_char == '-' || next_char == '+')) {
      if (seen_exponent_sign) {
        is.setstate(std::ios::failbit);
        return is;
      }
      seen_exponent_sign = true;
      exponent_sign = (next_char == '-') ? -1 : 1;
    } else if (::isdigit(next_char)) {
      seen_written_exponent_digits = true;
      // Hex-floats express their exponent as decimal.
      int_type digit =
          static_cast<int_type>(static_cast<int_type>(next_char) - '0');
      if (written_exponent >= (written_exponent_overflow - digit) / 10) {
        // The exponent is very big. Saturate rather than overflow the exponent.
        // signed integer, which would be undefined behaviour.
        written_exponent = written_exponent_overflow;
      } else {
        written_exponent = static_cast<int_type>(
            static_cast<int_type>(written_exponent * 10) + digit);
      }
    } else {
      break;
    }
    is.get();
    next_char = is.peek();
  }
  if (!seen_written_exponent_digits) {
    // Binary exponent had no digits.
    is.setstate(std::ios::failbit);
    return is;
  }

  written_exponent = static_cast<int_type>(written_exponent * exponent_sign);
  // Now fold in the exponent bias into the written exponent, updating exponent.
  // But avoid undefined behaviour that would result from overflowing int_type.
  if (written_exponent >= 0 && exponent >= 0) {
    // Saturate up to written_exponent_overflow.
    if (written_exponent_overflow - exponent > written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = written_exponent_overflow;
    }
  } else if (written_exponent < 0 && exponent < 0) {
    // Saturate down to -written_exponent_overflow.
    if (written_exponent_overflow + exponent > -written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = static_cast<int_type>(-written_exponent_overflow);
    }
  } else {
    // They're of opposing sign, so it's safe to add.
    exponent = static_cast<int_type>(written_exponent + exponent);
  }

  bool is_zero = (!has_integer_part) && (fraction == 0);
  if ((!has_integer_part) && !is_zero) {
    fraction = static_cast<uint_type>(fraction << 1);
    exponent = static_cast<int_type>(exponent - 1);
  } else if (is_zero) {
    exponent = 0;
  }

  if (exponent <= 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    fraction |= static_cast<uint_type>(1) << HF::top_bit_left_shift;
  }

  fraction = (fraction >> HF::fraction_right_shift) & HF::fraction_encode_mask;

  const int_type max_exponent =
      SetBits<uint_type, 0, HF::num_exponent_bits>::get;

  // Handle denorm numbers
  while (exponent < 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    exponent = static_cast<int_type>(exponent + 1);

    fraction &= HF::fraction_encode_mask;
    if (fraction == 0) {
      // We have underflowed our fraction. We should clamp to zero.
      is_zero = true;
      exponent = 0;
    }
  }

  // We have overflowed so we should be inf/-inf.
  if (exponent > max_exponent) {
    exponent = max_exponent;
    fraction = 0;
  }

  uint_type output_bits = static_cast<uint_type>(
      static_cast<uint_type>(negate_value ? 1 : 0) << HF::top_bit_left_shift);
  output_bits |= fraction;

  uint_type shifted_exponent = static_cast<uint_type>(
      static_cast<uint_type>(exponent << HF::exponent_left_shift) &
      HF::exponent_mask);
  output_bits |= shifted_exponent;

  T output_float(output_bits);
  value.set_value(output_float);

  return is;
}